

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdmath.cpp
# Opt level: O2

SQInteger math_exp(HSQUIRRELVM v)

{
  undefined8 in_RAX;
  float n;
  SQFloat f;
  
  f = (SQFloat)((ulong)in_RAX >> 0x20);
  sq_getfloat(v,2,&f);
  n = expf(f);
  sq_pushfloat(v,n);
  return 1;
}

Assistant:

static SQInteger math_min_max(HSQUIRRELVM v)
{
  SQInteger nArgs = sq_gettop(v);
  SQObject objRes;
  sq_getstackobj(v, 2, &objRes);

  for (SQInteger i = 3; i <= nArgs; ++i) {
    SQObject cur;
    sq_getstackobj(v, i, &cur);
    if (!(sq_type(cur) & SQOBJECT_NUMERIC)) {
      sq_throwparamtypeerror(v, i, _RT_FLOAT | _RT_INTEGER, sq_type(cur));
      return SQ_ERROR;
    }

    SQInteger cres = 0;
    if (!sq_cmpraw(v, cur, objRes, cres))
      return sq_throwerror(v, _SC("Internal error, comparison failed"));

    if (cres == CmpRes)
      objRes = cur;
  }

  sq_pushobject(v, objRes);
  return 1;
}